

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int relocatePage(BtShared *pBt,MemPage *pDbPage,u8 eType,Pgno iPtrPage,Pgno iFreePage,int isCommit)

{
  long lVar1;
  Pgno in_ECX;
  undefined1 in_DL;
  MemPage *in_RSI;
  undefined8 *in_RDI;
  Pgno in_R8D;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  Pgno nextOvfl;
  Pager *pPager;
  Pgno iDbPage;
  int rc;
  MemPage *pPtrPage;
  PgHdr *in_stack_ffffffffffffffa8;
  u32 in_stack_ffffffffffffffb4;
  MemPage **ppPage;
  undefined4 in_stack_ffffffffffffffc0;
  uint parent;
  u8 eType_00;
  undefined3 in_stack_ffffffffffffffd4;
  Pgno iFrom;
  char cVar2;
  int local_18;
  int local_14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iFrom = CONCAT13(in_DL,in_stack_ffffffffffffffd4);
  parent = in_RSI->pgno;
  ppPage = (MemPage **)*in_RDI;
  if (parent < 3) {
    local_18 = sqlite3CorruptError(0);
  }
  else {
    local_18 = sqlite3PagerMovepage
                         ((Pager *)CONCAT44(in_R8D,in_R9D),
                          (DbPage *)CONCAT44(parent,in_stack_ffffffffffffffc0),
                          (Pgno)((ulong)ppPage >> 0x20),(int)ppPage);
    if (local_18 == 0) {
      in_RSI->pgno = in_R8D;
      cVar2 = (char)(iFrom >> 0x18);
      if ((cVar2 == '\x05') || (cVar2 == '\x01')) {
        local_18 = setChildPtrmaps((MemPage *)CONCAT44(iFrom,in_ECX));
        local_14 = local_18;
        if (local_18 != 0) goto LAB_0016e43a;
      }
      else {
        in_stack_ffffffffffffffb4 = sqlite3Get4byte(in_RSI->aData);
        local_14 = local_18;
        if (in_stack_ffffffffffffffb4 != 0) {
          ptrmapPut((BtShared *)CONCAT44(iFrom,in_ECX),in_R8D,(u8)((uint)in_R9D >> 0x18),parent,
                    (int *)ppPage);
        }
      }
      if ((char)(iFrom >> 0x18) != '\x01') {
        local_18 = btreeGetPage((BtShared *)CONCAT44(in_R8D,in_R9D),parent,ppPage,
                                in_stack_ffffffffffffffb4);
        eType_00 = (u8)((uint)in_R9D >> 0x18);
        if (local_18 != 0) goto LAB_0016e43a;
        local_18 = sqlite3PagerWrite(in_stack_ffffffffffffffa8);
        if (local_18 != 0) {
          releasePage((MemPage *)0x16e3dc);
          goto LAB_0016e43a;
        }
        local_14 = modifyPagePointer(in_RSI,iFrom,in_ECX,(u8)(in_R8D >> 0x18));
        releasePage((MemPage *)0x16e40b);
        if (local_14 == 0) {
          ptrmapPut((BtShared *)CONCAT44(iFrom,in_ECX),in_R8D,eType_00,parent,(int *)ppPage);
        }
      }
      local_18 = local_14;
    }
  }
LAB_0016e43a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_18;
  }
  __stack_chk_fail();
}

Assistant:

static int relocatePage(
  BtShared *pBt,           /* Btree */
  MemPage *pDbPage,        /* Open page to move */
  u8 eType,                /* Pointer map 'type' entry for pDbPage */
  Pgno iPtrPage,           /* Pointer map 'page-no' entry for pDbPage */
  Pgno iFreePage,          /* The location to move pDbPage to */
  int isCommit             /* isCommit flag passed to sqlite3PagerMovepage */
){
  MemPage *pPtrPage;   /* The page that contains a pointer to pDbPage */
  Pgno iDbPage = pDbPage->pgno;
  Pager *pPager = pBt->pPager;
  int rc;

  assert( eType==PTRMAP_OVERFLOW2 || eType==PTRMAP_OVERFLOW1 ||
      eType==PTRMAP_BTREE || eType==PTRMAP_ROOTPAGE );
  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( pDbPage->pBt==pBt );
  if( iDbPage<3 ) return SQLITE_CORRUPT_BKPT;

  /* Move page iDbPage from its current location to page number iFreePage */
  TRACE(("AUTOVACUUM: Moving %u to free page %u (ptr page %u type %u)\n",
      iDbPage, iFreePage, iPtrPage, eType));
  rc = sqlite3PagerMovepage(pPager, pDbPage->pDbPage, iFreePage, isCommit);
  if( rc!=SQLITE_OK ){
    return rc;
  }
  pDbPage->pgno = iFreePage;

  /* If pDbPage was a btree-page, then it may have child pages and/or cells
  ** that point to overflow pages. The pointer map entries for all these
  ** pages need to be changed.
  **
  ** If pDbPage is an overflow page, then the first 4 bytes may store a
  ** pointer to a subsequent overflow page. If this is the case, then
  ** the pointer map needs to be updated for the subsequent overflow page.
  */
  if( eType==PTRMAP_BTREE || eType==PTRMAP_ROOTPAGE ){
    rc = setChildPtrmaps(pDbPage);
    if( rc!=SQLITE_OK ){
      return rc;
    }
  }else{
    Pgno nextOvfl = get4byte(pDbPage->aData);
    if( nextOvfl!=0 ){
      ptrmapPut(pBt, nextOvfl, PTRMAP_OVERFLOW2, iFreePage, &rc);
      if( rc!=SQLITE_OK ){
        return rc;
      }
    }
  }

  /* Fix the database pointer on page iPtrPage that pointed at iDbPage so
  ** that it points at iFreePage. Also fix the pointer map entry for
  ** iPtrPage.
  */
  if( eType!=PTRMAP_ROOTPAGE ){
    rc = btreeGetPage(pBt, iPtrPage, &pPtrPage, 0);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    rc = sqlite3PagerWrite(pPtrPage->pDbPage);
    if( rc!=SQLITE_OK ){
      releasePage(pPtrPage);
      return rc;
    }
    rc = modifyPagePointer(pPtrPage, iDbPage, iFreePage, eType);
    releasePage(pPtrPage);
    if( rc==SQLITE_OK ){
      ptrmapPut(pBt, iFreePage, eType, iPtrPage, &rc);
    }
  }
  return rc;
}